

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_internal.h
# Opt level: O0

int scalar_register(MOJOSHADER_shaderType shader_type,RegisterType regtype,int regnum)

{
  int regnum_local;
  RegisterType regtype_local;
  MOJOSHADER_shaderType shader_type_local;
  
  switch(regtype) {
  case REG_TYPE_RASTOUT:
    if (regnum == 1) {
      regtype_local = REG_TYPE_INPUT;
    }
    else if (regnum == 2) {
      regtype_local = REG_TYPE_INPUT;
    }
    else {
      regtype_local = REG_TYPE_TEMP;
    }
    break;
  default:
    regtype_local = REG_TYPE_TEMP;
    break;
  case REG_TYPE_DEPTHOUT:
  case REG_TYPE_CONSTBOOL:
  case REG_TYPE_LOOP:
    regtype_local = REG_TYPE_INPUT;
    break;
  case REG_TYPE_MISCTYPE:
    if (regnum == 1) {
      regtype_local = REG_TYPE_INPUT;
    }
    else {
      regtype_local = REG_TYPE_TEMP;
    }
    break;
  case REG_TYPE_MAX:
    regtype_local = (RegisterType)(shader_type == MOJOSHADER_TYPE_PIXEL);
  }
  return regtype_local;
}

Assistant:

static inline int scalar_register(const MOJOSHADER_shaderType shader_type,
                                  const RegisterType regtype, const int regnum)
{
    switch (regtype)
    {
        case REG_TYPE_RASTOUT:
            if (((const RastOutType) regnum) == RASTOUT_TYPE_FOG)
                return 1;
            else if (((const RastOutType) regnum) == RASTOUT_TYPE_POINT_SIZE)
                return 1;
            return 0;

        case REG_TYPE_DEPTHOUT:
        case REG_TYPE_CONSTBOOL:
        case REG_TYPE_LOOP:
            return 1;

        case REG_TYPE_MISCTYPE:
            if ( ((const MiscTypeType) regnum) == MISCTYPE_TYPE_FACE )
                return 1;
            return 0;

        case REG_TYPE_PREDICATE:
            return (shader_type == MOJOSHADER_TYPE_PIXEL) ? 1 : 0;

        default: break;
    } // switch

    return 0;
}